

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall
wabt::interp::Thread::
DoSimdExtaddPairwise<wabt::interp::Simd<int,(unsigned_char)4>,wabt::interp::Simd<short,(unsigned_char)8>>
          (Thread *this)

{
  u8 i;
  long lVar1;
  Simd<short,_(unsigned_char)__b_> val;
  Simd<int,_(unsigned_char)__x04_> result;
  anon_union_16_6_113bff37_for_Value_0 local_28;
  anon_union_16_6_113bff37_for_Value_0 local_18;
  
  local_28.v128_.v = (v128)Pop(this);
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    *(int *)((long)&local_18 + lVar1 * 4) =
         (int)*(short *)((long)&local_28 + lVar1 * 4 + 2) +
         (int)*(short *)((long)&local_28 + lVar1 * 4);
  }
  Push(this,(Value)local_18.v128_.v);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdExtaddPairwise() {
  auto val = Pop<T>();
  S result;
  using U = typename S::LaneType;
  for (u8 i = 0; i < S::lanes; ++i) {
    u8 laneidx = i * 2;
    result[i] = U(val[laneidx]) + U(val[laneidx + 1]);
  }
  Push(result);
  return RunResult::Ok;
}